

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  ImVector<ImGuiWindow_*> *this;
  ImDrawList *pIVar1;
  ImGuiWindow *this_00;
  ImFont *font;
  char *text;
  ImGuiContext *pIVar2;
  ImRect *r;
  ImGuiWindow *pIVar3;
  ImU32 IVar4;
  ImGuiWindow **ppIVar5;
  char *text_end;
  uint idx;
  int i;
  int i_00;
  undefined1 auVar6 [16];
  ImVec2 IVar9;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar10 [56];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [56];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ImRect IVar26;
  ImRect local_a8;
  float local_94;
  ImRect *local_90;
  ImGuiContext *local_88;
  ImRect local_80;
  ImVec2 *local_70;
  ImDrawList *local_68;
  ImGuiWindow *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar13 [64];
  
  pIVar2 = GImGui;
  local_60 = GImGui->CurrentWindow;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = (bb->Min).x;
  auVar6._4_4_ = (bb->Min).y;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = (bb->Max).x;
  auVar11._4_4_ = (bb->Max).y;
  auVar11 = vsubps_avx(auVar11,auVar6);
  IVar9 = (viewport->super_ImGuiViewport).Pos;
  auVar16._8_8_ = 0;
  auVar16._0_4_ = (viewport->super_ImGuiViewport).Size.x;
  auVar16._4_4_ = (viewport->super_ImGuiViewport).Size.y;
  local_48 = vdivps_avx(auVar11,auVar16);
  auVar12._0_4_ = local_48._0_4_ * IVar9.x;
  auVar12._4_4_ = local_48._4_4_ * IVar9.y;
  auVar12._8_4_ = local_48._8_4_ * 0.0;
  auVar12._12_4_ = local_48._12_4_ * 0.0;
  auVar13 = ZEXT1664(auVar12);
  local_58 = vsubps_avx(auVar6,auVar12);
  pIVar1 = local_60->DrawList;
  local_68 = draw_list;
  IVar4 = GetColorU32(5,0.4);
  auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
  local_90 = bb;
  local_70 = &bb->Max;
  ImDrawList::AddRectFilled(pIVar1,&bb->Min,&bb->Max,IVar4,0.0,0xf);
  local_88 = pIVar2;
  this = &pIVar2->Windows;
  for (i_00 = 0; i_00 != this->Size; i_00 = i_00 + 1) {
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
    auVar14 = auVar13._8_56_;
    auVar10 = auVar8._8_56_;
    this_00 = *ppIVar5;
    if ((this_00->WasActive == true) && ((this_00->Flags & 0x1000000) == 0)) {
      IVar26 = ImGuiWindow::Rect(this_00);
      auVar13._0_8_ = IVar26.Max;
      auVar13._8_56_ = auVar14;
      auVar8._0_8_ = IVar26.Min;
      auVar8._8_56_ = auVar10;
      local_a8 = (ImRect)vmovlhps_avx(auVar8._0_16_,auVar13._0_16_);
      IVar9 = local_a8.Max;
      IVar26 = ImGuiWindow::TitleBarRect(this_00);
      r = local_90;
      fVar18 = local_48._0_4_;
      fVar19 = local_48._4_4_;
      fVar20 = local_48._8_4_;
      fVar21 = local_48._12_4_;
      fVar22 = local_58._0_4_;
      fVar23 = local_58._4_4_;
      fVar24 = local_58._8_4_;
      fVar25 = local_58._12_4_;
      auVar15._0_4_ = (int)(fVar22 + fVar18 * local_a8.Min.x);
      auVar15._4_4_ = (int)(fVar23 + fVar19 * local_a8.Min.y);
      auVar15._8_4_ = (int)(fVar24 + fVar20 * 0.0);
      auVar15._12_4_ = (int)(fVar25 + fVar21 * 0.0);
      auVar11 = vcvtdq2ps_avx(auVar15);
      auVar17._0_4_ = (int)(fVar22 + fVar18 * local_a8.Max.x);
      auVar17._4_4_ = (int)(fVar23 + fVar19 * local_a8.Max.y);
      auVar17._8_4_ = (int)(fVar24 + fVar20 * 0.0);
      auVar17._12_4_ = (int)(fVar25 + fVar21 * 0.0);
      auVar6 = vcvtdq2ps_avx(auVar17);
      local_a8 = (ImRect)vmovlhps_avx(auVar11,auVar6);
      auVar7._0_4_ = (int)(fVar22 + fVar18 * IVar26.Min.x);
      auVar7._4_4_ = (int)(fVar23 + fVar19 * IVar26.Min.y);
      auVar7._8_4_ = (int)(fVar24 + fVar20 * IVar9.x);
      auVar7._12_4_ = (int)(fVar25 + fVar21 * IVar9.y);
      auVar11 = vcvtdq2ps_avx(auVar7);
      auVar6 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar22 + fVar18 * IVar26.Max.x)));
      auVar12 = vmovshdup_avx(auVar11);
      auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)(auVar12._0_4_ + 5.0)),0x1c);
      local_80 = (ImRect)vmovlhps_avx(auVar11,auVar6);
      ImRect::ClipWithFull(&local_a8,local_90);
      ImRect::ClipWithFull(&local_80,r);
      pIVar3 = local_60;
      idx = 10;
      if (local_88->NavWindow != (ImGuiWindow *)0x0) {
        idx = this_00->RootWindowForTitleBarHighlight ==
              local_88->NavWindow->RootWindowForTitleBarHighlight | 10;
      }
      pIVar1 = local_60->DrawList;
      IVar4 = GetColorU32(2,1.0);
      ImDrawList::AddRectFilled(pIVar1,&local_a8.Min,&local_a8.Max,IVar4,0.0,0xf);
      pIVar1 = pIVar3->DrawList;
      IVar4 = GetColorU32(idx,1.0);
      ImDrawList::AddRectFilled(pIVar1,&local_80.Min,&local_80.Max,IVar4,0.0,0xf);
      pIVar1 = pIVar3->DrawList;
      IVar4 = GetColorU32(5,1.0);
      ImDrawList::AddRect(pIVar1,&local_a8.Min,&local_a8.Max,IVar4,0.0,0xf,1.0);
      pIVar1 = pIVar3->DrawList;
      font = local_88->Font;
      local_94 = local_88->FontSize;
      IVar4 = GetColorU32(0,1.0);
      text = this_00->Name;
      text_end = FindRenderedTextEnd(text,(char *)0x0);
      auVar13 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar8 = ZEXT464((uint)local_94);
      ImDrawList::AddText(pIVar1,font,local_94,&local_80.Min,IVar4,text,text_end,0.0,(ImVec4 *)0x0);
    }
  }
  IVar4 = GetColorU32(5,1.0);
  ImDrawList::AddRect(local_68,&local_90->Min,local_70,IVar4,0.0,0xf,1.0);
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* thumb_window = g.Windows[i];
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImFloor(off + thumb_r.Min * scale), ImFloor(off +  thumb_r.Max * scale));
        title_r = ImRect(ImFloor(off + title_r.Min * scale), ImFloor(off +  ImVec2(title_r.Max.x, title_r.Min.y) * scale) + ImVec2(0,5)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
}